

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O1

void __thiscall DSDcc::DSDNXDN::processPostFrame(DSDNXDN *this)

{
  DSDDecoder *this_00;
  uint uVar1;
  int iVar2;
  
  if (this->m_symbolIndex < 10) {
    uVar1 = DSDSymbol::getDibit(&this->m_dsdDecoder->m_dsdSymbol);
    this->m_syncBuffer[this->m_symbolIndex] = (1 < uVar1) * '\x02' + '\x01';
    iVar2 = this->m_symbolIndex + 1;
    this->m_symbolIndex = iVar2;
    if (iVar2 == 10) {
      processFSW(this);
      return;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DSDNXDN::processPostFrame: out of sync (end)",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    this_00 = this->m_dsdDecoder;
    this_00->m_voice1On = false;
    DSDDecoder::resetFrameSync(this_00);
    this->m_inSync = false;
  }
  return;
}

Assistant:

void DSDNXDN::processPostFrame()
{
	if (m_symbolIndex < 10)
	{
	    int dibit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get dibit from symbol

        if ((dibit == 0) || (dibit == 1)) { // positives => 1 (+3)
            m_syncBuffer[m_symbolIndex] = 1;
        } else { // negatives => 3 (-3)
            m_syncBuffer[m_symbolIndex] = 3;
        }

		m_symbolIndex++;

		if (m_symbolIndex == 10) {
		    processFSW();
		}
	}
	else // out of sync => terminate
	{
        std::cerr << "DSDNXDN::processPostFrame: out of sync (end)" << std::endl;
        m_dsdDecoder->m_voice1On = false;
		m_dsdDecoder->resetFrameSync(); // end
		m_inSync = false;
	}
}